

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O1

bool __thiscall polyscope::TransformationGizmo::interact(TransformationGizmo *this)

{
  float fVar1;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  vec2 screenCoords;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  ulong uVar15;
  ulong uVar16;
  TransformHandle TVar29;
  mat4 *pmVar30;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *pPVar31;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar32;
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar40;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar41;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar42;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar43;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar44;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar45;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar46;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar47;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar48;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar49;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar50;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aVar51;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar52;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar53;
  undefined4 uVar54;
  bool bVar55;
  ImGuiIO *pIVar56;
  mapped_type *pmVar57;
  undefined8 unaff_RBP;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar58;
  TransformationGizmo *in_RSI;
  int iVar59;
  ulong uVar60;
  int iVar61;
  ulong uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined4 extraout_XMM0_Dc;
  undefined8 uVar81;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar80 [64];
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar98 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  float fVar110;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  vec3 vVar142;
  vec3 raySource;
  vec3 raySource_00;
  vec3 raySource_01;
  vec3 raySource_02;
  vec3 raySource_03;
  vec3 rayDir;
  vec3 rayDir_00;
  vec3 rayDir_01;
  vec3 rayDir_02;
  vec3 rayDir_03;
  vec3 rayDir_04;
  vec3 center;
  vec3 center_00;
  vec3 center_01;
  vec3 center_02;
  vec3 center_03;
  vec3 center_04;
  vec3 normal;
  vec3 normal_00;
  vec3 tangent;
  vec3 tangent_00;
  vec4 trans;
  float local_19c;
  float fStack_194;
  tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> local_188;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined8 local_f8;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  float fStack_c0;
  float fStack_bc;
  float local_b4;
  ulong local_b0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_a8;
  undefined8 local_a4;
  float local_9c;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 extraout_var [60];
  
  if ((this->enabled).value != true) {
    return false;
  }
  pIVar56 = ImGui::GetIO();
  uVar60 = CONCAT71((int7)((ulong)unaff_RBP >> 8),this->currentlyDragging);
  if ((this->currentlyDragging == true) &&
     ((bVar55 = ImGui::IsMouseDown(0), !bVar55 ||
      (bVar55 = ImGui::IsMousePosValid((ImVec2 *)0x0), !bVar55)))) {
    this->currentlyDragging = false;
  }
  vVar142 = view::getCameraWorldPosition();
  local_d8 = vVar142.field_2;
  local_e8 = vVar142._0_8_;
  screenCoords.field_0 =
       (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)(pIVar56->MousePos).x;
  screenCoords.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)(pIVar56->MousePos).y;
  uVar81 = 0;
  vVar142 = view::screenCoordsToWorldRay(screenCoords);
  local_108._8_8_ = uVar81;
  local_108._0_8_ = vVar142._0_8_;
  local_138._0_4_ = vVar142.field_2;
  pmVar30 = this->T;
  uVar3 = pmVar30->value[0].field_0;
  uVar17 = pmVar30->value[0].field_1;
  fVar82 = pmVar30->value[0].field_2.z;
  fVar97 = fVar82 * 0.0;
  fVar33 = pmVar30->value[1].field_0.x;
  fVar125 = pmVar30->value[1].field_1.y;
  fVar39 = *(float *)&pmVar30->value[1].field_1;
  fVar100 = pmVar30->value[1].field_2.z;
  fVar99 = fVar100 * 0.0;
  local_148._0_4_ = fVar97 + fVar99;
  local_118._0_4_ =
       *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)&pmVar30->value[2].field_0
  ;
  local_118._4_4_ = *(float *)&pmVar30->value[2].field_1;
  fVar107 = pmVar30->value[2].field_2.z;
  local_168.z = fVar107 * 0.0;
  local_f8._0_4_ = *(float *)&pmVar30->value[3].field_0;
  local_f8._4_4_ = *(float *)&pmVar30->value[3].field_1;
  fVar1 = pmVar30->value[3].field_2.z;
  fVar129 = fVar33 * 0.0;
  fVar133 = fVar125 * 0.0;
  fStack_110 = 0.0;
  fStack_10c = 0.0;
  fVar106 = fVar1 * 0.0;
  local_14c = local_168.z + fVar106;
  fVar82 = fVar82 + fVar99 + local_14c;
  local_14c = fVar97 + fVar100 + local_14c;
  fVar107 = fVar107 + fVar106;
  fStack_f0 = 0.0;
  fStack_ec = 0.0;
  local_78 = CONCAT44(local_118._4_4_ * 0.0,local_118._0_4_ * 0.0);
  uStack_70 = 0;
  local_88 = CONCAT44(local_f8._4_4_ * 0.0,(float)local_f8 * 0.0);
  uStack_80 = 0;
  fVar97 = local_118._0_4_ * 0.0 + (float)local_f8 * 0.0;
  fVar99 = local_118._4_4_ * 0.0 + local_f8._4_4_ * 0.0;
  fVar106 = fVar129 + (float)uVar3 + fVar97;
  fVar110 = fVar133 + (float)uVar17 + fVar99;
  auVar71._0_4_ = fVar106 * fVar106;
  auVar71._4_4_ = fVar110 * fVar110;
  auVar71._8_8_ = 0;
  auVar71 = vhaddps_avx(auVar71,auVar71);
  fVar100 = auVar71._0_4_ + fVar82 * fVar82;
  if (fVar100 < 0.0) {
    local_128._4_4_ = (float)uVar17 * 0.0;
    local_128._0_4_ = (float)uVar3 * 0.0;
    _fStack_120 = 0;
    local_c8 = (ImGuiIO *)CONCAT44(local_c8._4_4_,fVar82);
    fStack_40 = 0.0;
    fStack_3c = 0.0;
    fStack_50 = 0.0;
    fStack_4c = 0.0;
    fStack_60 = 0.0;
    fStack_5c = 0.0;
    local_b4 = fVar107;
    local_68 = fVar106;
    fStack_64 = fVar110;
    local_58 = fVar97;
    fStack_54 = fVar99;
    local_48 = fVar129;
    fStack_44 = fVar133;
    fVar73 = sqrtf(fVar100);
    fVar82 = (float)local_c8;
    fVar107 = local_b4;
    fVar97 = local_58;
    fVar99 = fStack_54;
    fVar100 = fStack_50;
    fVar101 = fStack_4c;
    fVar106 = local_68;
    fVar110 = fStack_64;
    fVar35 = fStack_60;
    fVar36 = fStack_5c;
    fVar125 = (float)local_128._0_4_;
    fVar126 = (float)local_128._4_4_;
    fVar127 = fStack_120;
    fVar128 = fStack_11c;
    fVar129 = local_48;
    fVar133 = fStack_44;
    fVar134 = fStack_40;
    fVar135 = fStack_3c;
  }
  else {
    auVar71 = vsqrtss_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100));
    fVar73 = auVar71._0_4_;
    fVar100 = 0.0;
    fVar101 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
    fVar39 = fVar125;
    fVar125 = (float)uVar3 * 0.0;
    fVar126 = (float)uVar17 * 0.0;
    fVar127 = 0.0;
    fVar128 = 0.0;
    fVar134 = 0.0;
    fVar135 = 0.0;
  }
  fVar73 = 1.0 / fVar73;
  auVar63._0_4_ = fVar106 * fVar73;
  auVar63._4_4_ = fVar110 * fVar73;
  auVar63._8_4_ = fVar35 * fVar73;
  auVar63._12_4_ = fVar36 * fVar73;
  local_b0 = vmovlps_avx(auVar63);
  local_a8.z = fVar82 * fVar73;
  fVar97 = fVar125 + fVar33 + fVar97;
  fVar99 = fVar126 + fVar39 + fVar99;
  fVar100 = fVar127 + 0.0 + fVar100;
  fVar101 = fVar128 + 0.0 + fVar101;
  auVar72._0_4_ = fVar97 * fVar97;
  auVar72._4_4_ = fVar99 * fVar99;
  auVar72._8_4_ = fVar100 * fVar100;
  auVar72._12_4_ = fVar101 * fVar101;
  auVar71 = vhaddps_avx(auVar72,auVar72);
  fVar82 = auVar71._0_4_ + local_14c * local_14c;
  local_128._0_4_ = fVar107 + (float)local_148._0_4_;
  if (fVar82 < 0.0) {
    local_c8 = (ImGuiIO *)CONCAT44(fVar99,fVar97);
    fStack_c0 = fVar100;
    fStack_bc = fVar101;
    fVar106 = sqrtf(fVar82);
    fVar82 = (float)local_128._0_4_;
    fVar97 = (float)local_c8;
    fVar99 = local_c8._4_4_;
    fVar100 = fStack_c0;
    fVar101 = fStack_bc;
  }
  else {
    auVar71 = vsqrtss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
    fVar106 = auVar71._0_4_;
    fVar82 = fVar107 + (float)local_148._0_4_;
  }
  fVar106 = 1.0 / fVar106;
  auVar64._0_4_ = fVar97 * fVar106;
  auVar64._4_4_ = fVar99 * fVar106;
  auVar64._8_4_ = fVar100 * fVar106;
  auVar64._12_4_ = fVar101 * fVar106;
  local_a4 = vmovlps_avx(auVar64);
  fVar107 = (float)local_88 + local_118._0_4_ + fVar125 + fVar129;
  fVar97 = local_88._4_4_ + local_118._4_4_ + fVar126 + fVar133;
  fVar99 = (float)uStack_80 + fStack_110 + fVar127 + fVar134;
  fVar110 = uStack_80._4_4_ + fStack_10c + fVar128 + fVar135;
  auVar65._0_4_ = fVar107 * fVar107;
  auVar65._4_4_ = fVar97 * fVar97;
  auVar65._8_4_ = fVar99 * fVar99;
  auVar65._12_4_ = fVar110 * fVar110;
  auVar71 = vhaddps_avx(auVar65,auVar65);
  local_9c = local_14c * fVar106;
  fVar100 = auVar71._0_4_ + fVar82 * fVar82;
  if (fVar100 < 0.0) {
    local_118 = CONCAT44(fVar97,fVar107);
    fStack_110 = fVar99;
    fStack_10c = fVar110;
    fVar100 = sqrtf(fVar100);
    fVar82 = (float)local_128._0_4_;
    fVar107 = local_118._0_4_;
    fVar97 = local_118._4_4_;
    fVar99 = fStack_110;
    fVar110 = fStack_10c;
  }
  else {
    auVar71 = vsqrtss_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100));
    fVar100 = auVar71._0_4_;
  }
  local_168.z = fVar1 + local_168.z;
  fVar100 = 1.0 / fVar100;
  auVar66._0_4_ = fVar107 * fVar100;
  auVar66._4_4_ = fVar97 * fVar100;
  auVar66._8_4_ = fVar99 * fVar100;
  auVar66._12_4_ = fVar110 * fVar100;
  local_98 = vmovlps_avx(auVar66);
  local_90 = fVar82 * fVar100;
  pmVar30 = this->T;
  fVar82 = pmVar30->value[0].field_0.x;
  fVar100 = pmVar30->value[0].field_1.y;
  fVar107 = pmVar30->value[0].field_2.z;
  fVar82 = fVar82 * fVar82 + fVar100 * fVar100 + fVar107 * fVar107;
  if (fVar82 < 0.0) {
    local_f8 = CONCAT44(local_78._4_4_ + local_f8._4_4_,(float)local_78 + (float)local_f8);
    fStack_f0 = (float)uStack_70 + fStack_f0;
    fStack_ec = uStack_70._4_4_ + fStack_ec;
    fVar100 = sqrtf(fVar82);
    fVar82 = (float)local_f8;
    fStack_164 = local_f8._4_4_;
    fStack_160 = fStack_f0;
    fStack_15c = fStack_ec;
  }
  else {
    auVar71 = vsqrtss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
    fVar100 = auVar71._0_4_;
    fVar82 = (float)local_78 + (float)local_f8;
    fStack_164 = local_78._4_4_ + local_f8._4_4_;
    fStack_160 = (float)uStack_70 + fStack_f0;
    fStack_15c = uStack_70._4_4_ + fStack_ec;
  }
  auVar71 = local_108;
  fVar82 = fVar82 + fVar125 + fVar129;
  fStack_164 = fStack_164 + fVar126 + fVar133;
  fStack_160 = fStack_160 + fVar127 + fVar134;
  fStack_15c = fStack_15c + fVar128 + fVar135;
  aVar32.z = local_168.z + (float)local_148._0_4_;
  fVar100 = fVar100 * this->gizmoSizeRel * state::lengthScale;
  fVar107 = fVar100 * this->diskWidthObj;
  local_168.z = fVar82;
  if (this->currentlyDragging == false) {
    local_88 = CONCAT44(local_88._4_4_,(int)uVar60);
    local_f8 = CONCAT44(local_f8._4_4_,fVar107);
    local_78 = CONCAT44(local_78._4_4_,fVar100);
    local_14c = fVar100 - fVar107;
    _local_128 = ZEXT812(0);
    fStack_11c = 0.0;
    local_118 = local_118 & 0xffffffff00000000;
    uVar62 = 0;
    uVar60 = 0xffffffff;
    paVar58 = &local_a8;
    local_148._0_4_ = INFINITY;
    local_19c = INFINITY;
    iVar61 = 0;
    local_c8 = pIVar56;
    do {
      auVar71 = local_108;
      center_00.field_1.y = fStack_164;
      center_00.field_0.x = local_168.z;
      vVar142.field_2 = local_d8;
      vVar142.field_0.x = (float)local_e8;
      vVar142.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_e8._4_4_;
      rayDir_00.field_2 =
           (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_138._0_4_;
      rayDir_00.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_108._0_4_;
      rayDir_00.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_108._4_4_;
      center_00.field_2.z = aVar32.z;
      normal_00.field_2 = *paVar58;
      normal_00._0_8_ = *(undefined8 *)(paVar58 + -2);
      local_108 = auVar71;
      circleTest(&local_188,in_RSI,vVar142,rayDir_00,center_00,normal_00,local_14c);
      if ((local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<1UL,_float,_false>._M_head_impl < (float)local_f8) &&
         (local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Head_base<0UL,_float,_false>._M_head_impl < (float)local_148._0_4_)) {
        _fStack_120 = 0;
        local_128._0_4_ =
             local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
             field_0;
        local_128._4_4_ =
             local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
             field_1;
        local_118 = CONCAT44(local_118._4_4_,
                             local_188.
                             super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>
                             .super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>.
                             _M_head_impl.field_2);
        iVar61 = 1;
        uVar60 = uVar62 & 0xffffffff;
        local_19c = local_188.
                    super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Head_base<1UL,_float,_false>._M_head_impl;
        local_148._0_4_ =
             local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<0UL,_float,_false>._M_head_impl;
      }
      uVar62 = uVar62 + 1;
      paVar58 = paVar58 + 3;
    } while (uVar62 != 3);
    paVar58 = &local_a8;
    uVar62 = 0;
    do {
      auVar71 = local_108;
      center_01.field_1.y = fStack_164;
      center_01.field_0.x = local_168.z;
      raySource_00.field_2 = local_d8;
      raySource_00.field_0.x = (float)local_e8;
      raySource_00.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_e8._4_4_;
      rayDir_01.field_2 =
           (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_138._0_4_;
      rayDir_01.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_108._0_4_;
      rayDir_01.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_108._4_4_;
      center_01.field_2.z = aVar32.z;
      tangent.field_2 = *paVar58;
      tangent._0_8_ = *(undefined8 *)(paVar58 + -2);
      local_108 = auVar71;
      lineTest(&local_188,in_RSI,raySource_00,rayDir_01,center_01,tangent,
               (float)local_78 * this->vecLength);
      auVar71 = local_108;
      if ((local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<1UL,_float,_false>._M_head_impl < (float)local_f8) &&
         (local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Head_base<0UL,_float,_false>._M_head_impl - (float)local_f8 <
          (float)local_148._0_4_)) {
        _fStack_120 = 0;
        local_128._0_4_ =
             local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
             field_0;
        local_128._4_4_ =
             local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
             field_1;
        local_118 = CONCAT44(local_118._4_4_,
                             local_188.
                             super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>
                             .super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>.
                             _M_head_impl.field_2);
        iVar61 = 2;
        uVar60 = uVar62 & 0xffffffff;
        local_19c = local_188.
                    super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Head_base<1UL,_float,_false>._M_head_impl;
        local_148._0_4_ =
             local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<0UL,_float,_false>._M_head_impl - (float)local_f8;
      }
      iVar59 = (int)uVar60;
      uVar62 = uVar62 + 1;
      paVar58 = paVar58 + 3;
    } while (uVar62 != 3);
    center_02.field_1.y = fStack_164;
    center_02.field_0.x = local_168.z;
    raySource_01.field_2 = local_d8;
    raySource_01.field_0.x = (float)local_e8;
    raySource_01.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_e8._4_4_;
    rayDir_02.field_2 =
         (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_138._0_4_;
    rayDir_02.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_108._0_4_;
    rayDir_02.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_108._4_4_;
    center_02.field_2.z = aVar32.z;
    local_108 = auVar71;
    sphereTest(&local_188,in_RSI,raySource_01,rayDir_02,center_02,(float)local_78 * this->sphereRad,
               true);
    if (((local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Head_base<1UL,_float,_false>._M_head_impl == 0.0) &&
        (!NAN(local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>
              .super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
              super__Head_base<1UL,_float,_false>._M_head_impl))) &&
       (local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
        super__Head_base<0UL,_float,_false>._M_head_impl < (float)local_148._0_4_)) {
      _fStack_120 = 0;
      local_128._0_4_ =
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0;
      local_128._4_4_ =
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1;
      local_118 = CONCAT44(local_118._4_4_,
                           local_188.
                           super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>
                           .super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>.
                           _M_head_impl.field_2);
      iVar59 = 0;
      iVar61 = 3;
      local_19c = local_188.
                  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                  super__Head_base<1UL,_float,_false>._M_head_impl;
    }
    uVar60 = local_88 & 0xffffffff;
    this->selectedDim = -1;
    this->selectedType = None;
    if ((iVar61 != 1) || ((float)local_f8 <= local_19c)) {
      if ((iVar61 != 2) || ((float)local_f8 <= local_19c)) {
        if (iVar61 != 3) goto LAB_00237a5a;
        this->selectedDim = -1;
        this->selectedType = Scale;
      }
      else {
        this->selectedType = Translation;
        this->selectedDim = iVar59;
      }
      bVar55 = ImGui::IsMouseClicked(0,false);
      if ((!bVar55) || (local_c8->WantCaptureMouse != false)) goto LAB_00237a5a;
      this->currentlyDragging = true;
      uVar81 = vmovlps_avx(_local_128);
      (this->dragPrevVec).field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar81;
      (this->dragPrevVec).field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar81 >> 0x20);
      local_168 = local_118._0_4_;
    }
    else {
      this->selectedType = Rotation;
      this->selectedDim = iVar59;
      bVar55 = ImGui::IsMouseClicked(0,false);
      if ((!bVar55) || (local_c8->WantCaptureMouse != false)) goto LAB_00237a5a;
      this->currentlyDragging = true;
      auVar67._4_4_ = fStack_164;
      auVar67._0_4_ = local_168;
      auVar67._8_4_ = fStack_160;
      auVar67._12_4_ = fStack_15c;
      _local_148 = vsubps_avx(_local_128,auVar67);
      auVar68._0_4_ = local_148._0_4_ * local_148._0_4_;
      auVar68._4_4_ = local_148._4_4_ * local_148._4_4_;
      auVar68._8_4_ = local_148._8_4_ * local_148._8_4_;
      auVar68._12_4_ = local_148._12_4_ * local_148._12_4_;
      auVar71 = vhaddps_avx(auVar68,auVar68);
      fVar100 = local_118._0_4_ - aVar32.z;
      fVar82 = auVar71._0_4_ + fVar100 * fVar100;
      if (fVar82 < 0.0) {
        fVar82 = sqrtf(fVar82);
      }
      else {
        auVar71 = vsqrtss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
        fVar82 = auVar71._0_4_;
      }
      fVar82 = 1.0 / fVar82;
      auVar69._0_4_ = local_148._0_4_ * fVar82;
      auVar69._4_4_ = local_148._4_4_ * fVar82;
      auVar69._8_4_ = local_148._8_4_ * fVar82;
      auVar69._12_4_ = local_148._12_4_ * fVar82;
      local_168.z = fVar100 * fVar82;
      uVar81 = vmovlps_avx(auVar69);
      (this->dragPrevVec).field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar81;
      (this->dragPrevVec).field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar81 >> 0x20);
    }
  }
  else {
    TVar29 = this->selectedType;
    uVar54 = local_138._0_4_;
    local_108 = auVar71;
    if (TVar29 == Scale) {
      local_148._0_4_ = fVar100 * this->sphereRad;
      center_04.field_1.y = fStack_164;
      center_04.field_0.x = fVar82;
      raySource_03.field_2 = local_d8;
      raySource_03.field_0.x = (float)local_e8;
      raySource_03.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_e8._4_4_;
      rayDir_04.field_2 =
           (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_138._0_4_;
      rayDir_04.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_108._0_4_;
      rayDir_04.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_108._4_4_;
      center_04.field_2.z = aVar32.z;
      sphereTest(&local_188,in_RSI,raySource_03,rayDir_04,center_04,(float)local_148._0_4_,false);
      if (INFINITY <=
          local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Head_base<1UL,_float,_false>._M_head_impl) goto LAB_00237a5a;
      local_138._8_8_ = 0;
      local_138._0_4_ =
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0;
      local_138._4_4_ =
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1;
      auVar70._4_4_ = fStack_164;
      auVar70._0_4_ = local_168;
      auVar70._8_4_ = fStack_160;
      auVar70._12_4_ = fStack_15c;
      auVar71 = vsubps_avx(local_138,auVar70);
      auVar76._0_4_ = auVar71._0_4_ * auVar71._0_4_;
      auVar76._4_4_ = auVar71._4_4_ * auVar71._4_4_;
      auVar76._8_4_ = auVar71._8_4_ * auVar71._8_4_;
      auVar76._12_4_ = auVar71._12_4_ * auVar71._12_4_;
      auVar71 = vhaddps_avx(auVar76,auVar76);
      local_168.z = local_188.
                    super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl
                    .field_2.z;
      fVar82 = auVar71._0_4_ +
               (local_188.
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
                field_2.z - aVar32.z) *
               (local_188.
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
                field_2.z - aVar32.z);
      if (fVar82 < 0.0) {
        fVar82 = sqrtf(fVar82);
      }
      else {
        auVar71 = vsqrtss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
        fVar82 = auVar71._0_4_;
      }
      fVar82 = fVar82 / (float)local_148._0_4_;
      pmVar30 = this->T;
      local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
            &pmVar30->value[3].field_0;
      local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)
            &pmVar30->value[3].field_1;
      local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
           *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
            &pmVar30->value[3].field_2;
      local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<1UL,_float,_false>._M_head_impl = *(float *)&pmVar30->value[3].field_3;
      pmVar30->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
      pmVar30->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
      pmVar30->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      pmVar30->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
      pmVar30 = this->T;
      uVar6 = pmVar30->value[0].field_0;
      uVar20 = pmVar30->value[0].field_1;
      uVar7 = pmVar30->value[0].field_2;
      uVar21 = pmVar30->value[0].field_3;
      uVar8 = pmVar30->value[1].field_0;
      uVar22 = pmVar30->value[1].field_1;
      uVar9 = pmVar30->value[1].field_2;
      uVar23 = pmVar30->value[1].field_3;
      auVar85._0_4_ = fVar82 * (float)uVar6;
      auVar85._4_4_ = fVar82 * (float)uVar20;
      auVar85._8_4_ = fVar82 * 0.0;
      auVar85._12_4_ = fVar82 * 0.0;
      auVar90._0_4_ = fVar82 * (float)uVar7;
      auVar90._4_4_ = fVar82 * (float)uVar21;
      auVar90._8_4_ = fVar82 * 0.0;
      auVar90._12_4_ = fVar82 * 0.0;
      uVar81 = vmovlps_avx(auVar85);
      pmVar30->value[0].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar81;
      pmVar30->value[0].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar81 >> 0x20);
      uVar81 = vmovlps_avx(auVar90);
      pmVar30->value[0].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar81;
      pmVar30->value[0].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar81 >> 0x20);
      auVar86._0_4_ = fVar82 * (float)uVar8;
      auVar86._4_4_ = fVar82 * (float)uVar22;
      auVar86._8_4_ = fVar82 * 0.0;
      auVar86._12_4_ = fVar82 * 0.0;
      auVar91._0_4_ = fVar82 * (float)uVar9;
      auVar91._4_4_ = fVar82 * (float)uVar23;
      auVar91._8_4_ = fVar82 * 0.0;
      auVar91._12_4_ = fVar82 * 0.0;
      uVar81 = vmovlps_avx(auVar86);
      pmVar30->value[1].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar81;
      pmVar30->value[1].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar81 >> 0x20);
      uVar81 = vmovlps_avx(auVar91);
      pmVar30->value[1].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar81;
      pmVar30->value[1].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar81 >> 0x20);
      uVar10 = pmVar30->value[2].field_0;
      uVar24 = pmVar30->value[2].field_1;
      auVar87._0_4_ = fVar82 * (float)uVar10;
      auVar87._4_4_ = fVar82 * (float)uVar24;
      auVar87._8_4_ = fVar82 * 0.0;
      auVar87._12_4_ = fVar82 * 0.0;
      uVar11 = pmVar30->value[2].field_2;
      uVar25 = pmVar30->value[2].field_3;
      auVar92._0_4_ = fVar82 * (float)uVar11;
      auVar92._4_4_ = fVar82 * (float)uVar25;
      auVar92._8_4_ = fVar82 * 0.0;
      auVar92._12_4_ = fVar82 * 0.0;
      uVar81 = vmovlps_avx(auVar87);
      pmVar30->value[2].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar81;
      pmVar30->value[2].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar81 >> 0x20);
      uVar81 = vmovlps_avx(auVar92);
      pmVar30->value[2].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar81;
      pmVar30->value[2].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar81 >> 0x20);
      uVar12 = pmVar30->value[3].field_0;
      uVar26 = pmVar30->value[3].field_1;
      auVar88._0_4_ = fVar82 * (float)uVar12;
      auVar88._4_4_ = fVar82 * (float)uVar26;
      auVar88._8_4_ = fVar82 * 0.0;
      auVar88._12_4_ = fVar82 * 0.0;
      uVar13 = pmVar30->value[3].field_2;
      uVar27 = pmVar30->value[3].field_3;
      auVar77._0_4_ = fVar82 * (float)uVar13;
      auVar77._4_4_ = fVar82 * (float)uVar27;
      auVar77._8_4_ = fVar82 * 0.0;
      auVar77._12_4_ = fVar82 * 0.0;
      uVar81 = vmovlps_avx(auVar88);
      pmVar30->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar81;
      pmVar30->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar81 >> 0x20);
      uVar81 = vmovlps_avx(auVar77);
      pmVar30->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar81;
      pmVar30->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar81 >> 0x20);
      pmVar30 = this->T;
      pmVar30->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0;
      pmVar30->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1;
      pmVar30->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2;
      pmVar30->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<1UL,_float,_false>._M_head_impl;
      pPVar31 = this->Tpers;
      if (pPVar31 != (PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)0x0) {
        pmVar57 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&detail::persistentCache_glmmat4,&pPVar31->name);
        aVar40 = (pPVar31->value).value[0].field_1;
        aVar2 = (pPVar31->value).value[0].field_2;
        aVar41 = (pPVar31->value).value[0].field_3;
        aVar42 = (pPVar31->value).value[1].field_0;
        aVar43 = (pPVar31->value).value[1].field_1;
        aVar44 = (pPVar31->value).value[1].field_2;
        aVar45 = (pPVar31->value).value[1].field_3;
        aVar46 = (pPVar31->value).value[2].field_0;
        aVar47 = (pPVar31->value).value[2].field_1;
        aVar48 = (pPVar31->value).value[2].field_2;
        aVar49 = (pPVar31->value).value[2].field_3;
        aVar50 = (pPVar31->value).value[3].field_0;
        aVar51 = (pPVar31->value).value[3].field_1;
        aVar52 = (pPVar31->value).value[3].field_2;
        aVar53 = (pPVar31->value).value[3].field_3;
        pmVar57->value[0].field_0 = (pPVar31->value).value[0].field_0;
        pmVar57->value[0].field_1 = aVar40;
        pmVar57->value[0].field_2 = aVar2;
        pmVar57->value[0].field_3 = aVar41;
        pmVar57->value[1].field_0 = aVar42;
        pmVar57->value[1].field_1 = aVar43;
        pmVar57->value[1].field_2 = aVar44;
        pmVar57->value[1].field_3 = aVar45;
        pmVar57->value[2].field_0 = aVar46;
        pmVar57->value[2].field_1 = aVar47;
        pmVar57->value[2].field_2 = aVar48;
        pmVar57->value[2].field_3 = aVar49;
        pmVar57->value[3].field_0 = aVar50;
        pmVar57->value[3].field_1 = aVar51;
        pmVar57->value[3].field_2 = aVar52;
        pmVar57->value[3].field_3 = aVar53;
        pPVar31->holdsDefaultValue = false;
      }
      requestRedraw();
    }
    else {
      if (TVar29 == Translation) {
        center_03.field_1.y = fStack_164;
        center_03.field_0.x = fVar82;
        raySource_02.field_2 = local_d8;
        raySource_02.field_0.x = (float)local_e8;
        raySource_02.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_e8._4_4_;
        rayDir_03.field_2 =
             (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)local_138._0_4_;
        rayDir_03.field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_108._0_4_;
        rayDir_03.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_108._4_4_;
        center_03.field_2.z = aVar32.z;
        tangent_00.field_2 = (&local_a8)[(long)this->selectedDim * 3];
        tangent_00._0_8_ = *(undefined8 *)((long)&local_b0 + (long)this->selectedDim * 0xc);
        lineTest(&local_188,in_RSI,raySource_02,rayDir_03,center_03,tangent_00,INFINITY);
        if (INFINITY <=
            local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
            super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
            super__Head_base<1UL,_float,_false>._M_head_impl) goto LAB_00237a5a;
        _fStack_140 = 0;
        local_148._0_4_ =
             local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
             field_0;
        local_148._4_4_ =
             local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
             super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
             field_1;
        fVar82 = (this->dragPrevVec).field_2.z;
        pmVar30 = this->T;
        uVar4 = (this->dragPrevVec).field_0;
        uVar18 = (this->dragPrevVec).field_1;
        auVar83._4_4_ = uVar18;
        auVar83._0_4_ = uVar4;
        auVar83._8_8_ = 0;
        auVar71 = vsubps_avx(_local_148,auVar83);
        uVar5 = pmVar30->value[3].field_0;
        uVar19 = pmVar30->value[3].field_1;
        auVar84._0_4_ = auVar71._0_4_ + (float)uVar5;
        auVar84._4_4_ = auVar71._4_4_ + (float)uVar19;
        auVar84._8_4_ = auVar71._8_4_ + 0.0;
        auVar84._12_4_ = auVar71._12_4_ + 0.0;
        uVar81 = vmovlps_avx(auVar84);
        pmVar30->value[3].field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar81;
        pmVar30->value[3].field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
             (int)((ulong)uVar81 >> 0x20);
        pmVar30->value[3].field_2.z =
             (local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>
              .super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
              super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
              super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.
              field_2.z - fVar82) + pmVar30->value[3].field_2.z;
        pPVar31 = this->Tpers;
        if (pPVar31 != (PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)0x0) {
          pmVar57 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&detail::persistentCache_glmmat4,&pPVar31->name);
          aVar40 = (pPVar31->value).value[0].field_1;
          aVar2 = (pPVar31->value).value[0].field_2;
          aVar41 = (pPVar31->value).value[0].field_3;
          aVar42 = (pPVar31->value).value[1].field_0;
          aVar43 = (pPVar31->value).value[1].field_1;
          aVar44 = (pPVar31->value).value[1].field_2;
          aVar45 = (pPVar31->value).value[1].field_3;
          aVar46 = (pPVar31->value).value[2].field_0;
          aVar47 = (pPVar31->value).value[2].field_1;
          aVar48 = (pPVar31->value).value[2].field_2;
          aVar49 = (pPVar31->value).value[2].field_3;
          aVar50 = (pPVar31->value).value[3].field_0;
          aVar51 = (pPVar31->value).value[3].field_1;
          aVar52 = (pPVar31->value).value[3].field_2;
          aVar53 = (pPVar31->value).value[3].field_3;
          pmVar57->value[0].field_0 = (pPVar31->value).value[0].field_0;
          pmVar57->value[0].field_1 = aVar40;
          pmVar57->value[0].field_2 = aVar2;
          pmVar57->value[0].field_3 = aVar41;
          pmVar57->value[1].field_0 = aVar42;
          pmVar57->value[1].field_1 = aVar43;
          pmVar57->value[1].field_2 = aVar44;
          pmVar57->value[1].field_3 = aVar45;
          pmVar57->value[2].field_0 = aVar46;
          pmVar57->value[2].field_1 = aVar47;
          pmVar57->value[2].field_2 = aVar48;
          pmVar57->value[2].field_3 = aVar49;
          pmVar57->value[3].field_0 = aVar50;
          pmVar57->value[3].field_1 = aVar51;
          pmVar57->value[3].field_2 = aVar52;
          pmVar57->value[3].field_3 = aVar53;
          pPVar31->holdsDefaultValue = false;
        }
        requestRedraw();
        uVar81 = vmovlps_avx(_local_148);
        (this->dragPrevVec).field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar81;
        (this->dragPrevVec).field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
             (int)((ulong)uVar81 >> 0x20);
        local_168 = local_188.
                    super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl
                    .field_2;
        goto LAB_00237a52;
      }
      if (TVar29 != Rotation) goto LAB_00237a5a;
      local_148 = *(undefined1 (*) [8])((long)&local_b0 + (long)this->selectedDim * 0xc);
      center.field_1.y = fStack_164;
      center.field_0.x = fVar82;
      _fStack_140 = 0;
      local_138._0_4_ = (&local_a8)[(long)this->selectedDim * 3];
      raySource.field_2 = local_d8;
      raySource.field_0.x = (float)local_e8;
      raySource.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_e8._4_4_;
      rayDir.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)uVar54;
      rayDir.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_108._0_4_;
      rayDir.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_108._4_4_;
      center.field_2.z = aVar32.z;
      normal.field_2 = (&local_a8)[(long)this->selectedDim * 3];
      normal.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)SUB84(local_148,0);
      normal.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)local_148 >> 0x20);
      circleTest(&local_188,in_RSI,raySource,rayDir,center,normal,fVar100 - fVar107);
      if (INFINITY <=
          local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
          super__Head_base<1UL,_float,_false>._M_head_impl) goto LAB_00237a5a;
      auVar74._8_8_ = 0;
      auVar74._0_4_ =
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0;
      auVar74._4_4_ =
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1;
      auVar37._4_4_ = fStack_164;
      auVar37._0_4_ = local_168;
      auVar37._8_4_ = fStack_160;
      auVar37._12_4_ = fStack_15c;
      auVar71 = vsubps_avx(auVar74,auVar37);
      fVar100 = auVar71._0_4_;
      auVar75._0_4_ = fVar100 * fVar100;
      fVar107 = auVar71._4_4_;
      auVar75._4_4_ = fVar107 * fVar107;
      fVar1 = auVar71._8_4_;
      auVar75._8_4_ = fVar1 * fVar1;
      fVar97 = auVar71._12_4_;
      auVar75._12_4_ = fVar97 * fVar97;
      auVar71 = vhaddps_avx(auVar75,auVar75);
      local_168.z = local_188.
                    super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
                    super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl
                    .field_2.z - aVar32.z;
      fVar82 = auVar71._0_4_ + local_168.z * local_168.z;
      if (fVar82 < 0.0) {
        fVar82 = sqrtf(fVar82);
      }
      else {
        auVar71 = vsqrtss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
        fVar82 = auVar71._0_4_;
      }
      fVar82 = 1.0 / fVar82;
      auVar111._0_4_ = fVar100 * fVar82;
      auVar111._4_4_ = fVar107 * fVar82;
      auVar111._8_4_ = fVar1 * fVar82;
      auVar111._12_4_ = fVar97 * fVar82;
      auVar71 = vmovshdup_avx(auVar111);
      local_168.z = local_168.z * fVar82;
      fVar82 = (this->dragPrevVec).field_0.x;
      fVar100 = (this->dragPrevVec).field_1.y;
      fVar107 = (this->dragPrevVec).field_2.z;
      auVar63 = vfmsub231ss_fma(ZEXT416((uint)(fVar107 * auVar71._0_4_)),ZEXT416((uint)fVar100),
                                ZEXT416((uint)local_168));
      auVar72 = vfmsub231ss_fma(ZEXT416((uint)(fVar82 * local_168.z)),auVar111,
                                ZEXT416((uint)fVar107));
      auVar71 = vfmsub231ss_fma(ZEXT416((uint)(fVar100 * auVar111._0_4_)),ZEXT416((uint)fVar82),
                                auVar71);
      local_108 = vmovshdup_avx(_local_148);
      auVar71 = vmaxss_avx(SUB6416(ZEXT464(0xbf800000),0),
                           ZEXT416((uint)(auVar71._0_4_ * (float)local_138._0_4_ +
                                         local_148._0_4_ * auVar63._0_4_ +
                                         local_108._0_4_ * auVar72._0_4_)));
      auVar71 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar71);
      fVar82 = asinf(auVar71._0_4_);
      local_e8 = CONCAT44(local_e8._4_4_,fVar82);
      pmVar30 = this->T;
      local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
            &pmVar30->value[3].field_0;
      local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)
            &pmVar30->value[3].field_1;
      local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
           *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
            &pmVar30->value[3].field_2;
      local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
      super__Head_base<1UL,_float,_false>._M_head_impl = *(float *)&pmVar30->value[3].field_3;
      pmVar30->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
      pmVar30->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
      pmVar30->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      pmVar30->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
      local_d8.z = cosf(fVar82);
      uStack_d4 = extraout_XMM0_Db;
      uStack_d0 = extraout_XMM0_Dc;
      uStack_cc = extraout_XMM0_Dd;
      auVar80._0_4_ = sinf((float)local_e8);
      auVar80._4_60_ = extraout_var;
      fVar82 = (float)local_138._0_4_ * (float)local_138._0_4_ +
               (float)local_148._0_4_ * (float)local_148._0_4_ +
               (float)local_108._0_4_ * (float)local_108._0_4_;
      if (fVar82 < 0.0) {
        local_108 = auVar80._0_16_;
        fVar82 = sqrtf(fVar82);
        auVar71 = local_108;
      }
      else {
        auVar71 = vsqrtss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
        fVar82 = auVar71._0_4_;
        auVar71 = auVar80._0_16_;
      }
      fVar82 = 1.0 / fVar82;
      fVar1 = fVar82 * (float)local_138._0_4_;
      auVar38._4_4_ = uStack_d4;
      auVar38._0_4_ = local_d8;
      auVar38._8_4_ = uStack_d0;
      auVar38._12_4_ = uStack_cc;
      fVar33 = 1.0 - local_d8.z;
      fVar97 = fVar33 * fVar1;
      auVar34._8_4_ = 0x80000000;
      auVar34._0_8_ = 0x8000000080000000;
      auVar34._12_4_ = 0x80000000;
      auVar63 = vxorps_avx512vl(auVar71,auVar34);
      auVar72 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar97),ZEXT416((uint)fVar1));
      fVar99 = auVar72._0_4_ * 0.0;
      pmVar30 = this->T;
      fVar100 = pmVar30->value[0].field_3.w;
      fVar107 = pmVar30->value[1].field_3.w;
      fVar106 = fVar100 * 0.0;
      fVar110 = fVar107 * 0.0;
      auVar76 = ZEXT416((uint)pmVar30->value[2].field_3);
      auVar64 = vmulss_avx512f(auVar76,ZEXT816(0));
      auVar77 = ZEXT416((uint)pmVar30->value[3].field_3);
      auVar65 = vmulss_avx512f(auVar77,ZEXT816(0));
      auVar102._0_4_ = fVar82 * (float)local_148._0_4_;
      auVar102._4_4_ = fVar82 * (float)local_148._4_4_;
      auVar102._8_4_ = fVar82 * fStack_140;
      auVar102._12_4_ = fVar82 * fStack_13c;
      auVar112._0_4_ = fVar33 * auVar102._0_4_;
      auVar112._4_4_ = fVar33 * auVar102._4_4_;
      auVar112._8_4_ = fVar33 * auVar102._8_4_;
      auVar112._12_4_ = fVar33 * auVar102._12_4_;
      auVar108._4_4_ = fVar1;
      auVar108._0_4_ = fVar1;
      auVar108._8_4_ = fVar1;
      auVar108._12_4_ = fVar1;
      auVar71 = vinsertps_avx(auVar71,auVar63,0x10);
      auVar136._0_4_ = auVar71._0_4_ * fVar1;
      auVar136._4_4_ = auVar71._4_4_ * fVar1;
      auVar136._8_4_ = auVar71._8_4_ * fVar1;
      auVar136._12_4_ = auVar71._12_4_ * fVar1;
      auVar66 = vshufps_avx512vl(auVar102,auVar102,0xe1);
      auVar67 = vfmadd231ps_avx512vl(auVar136,auVar112,auVar66);
      auVar63 = vbroadcastss_avx512vl(auVar38);
      auVar68 = vfmadd231ps_avx512vl(auVar63,auVar112,auVar102);
      auVar71 = vshufps_avx(auVar71,auVar71,0xe1);
      auVar63 = vmulps_avx512vl(auVar71,auVar66);
      auVar63 = vfmadd231ps_fma(auVar63,auVar112,auVar108);
      auVar103._0_4_ = auVar71._0_4_ * auVar102._0_4_;
      auVar103._4_4_ = auVar71._4_4_ * auVar102._4_4_;
      auVar103._8_4_ = auVar71._8_4_ * auVar102._8_4_;
      auVar103._12_4_ = auVar71._12_4_ * auVar102._12_4_;
      auVar118._4_4_ = fVar97;
      auVar118._0_4_ = fVar97;
      auVar118._8_4_ = fVar97;
      auVar118._12_4_ = fVar97;
      auVar66 = vfmadd213ps_avx512vl(auVar118,auVar66,auVar103);
      auVar69 = vmulps_avx512vl(auVar67,ZEXT416(0) << 0x20);
      auVar70 = vmulps_avx512vl(auVar68,ZEXT416(0) << 0x20);
      auVar78._0_4_ = auVar63._0_4_ * 0.0;
      auVar78._4_4_ = auVar63._4_4_ * 0.0;
      auVar78._8_4_ = auVar63._8_4_ * 0.0;
      auVar78._12_4_ = auVar63._12_4_ * 0.0;
      auVar71 = vaddps_avx512vl(auVar67,auVar70);
      auVar67 = vaddps_avx512vl(auVar68,auVar69);
      auVar109._0_4_ = auVar78._0_4_ + auVar71._0_4_;
      auVar109._4_4_ = auVar78._4_4_ + auVar71._4_4_;
      auVar109._8_4_ = auVar78._8_4_ + auVar71._8_4_;
      auVar109._12_4_ = auVar78._12_4_ + auVar71._12_4_;
      auVar113._0_4_ = auVar78._0_4_ + auVar67._0_4_;
      auVar113._4_4_ = auVar78._4_4_ + auVar67._4_4_;
      auVar113._8_4_ = auVar78._8_4_ + auVar67._8_4_;
      auVar113._12_4_ = auVar78._12_4_ + auVar67._12_4_;
      auVar137._0_4_ = auVar66._0_4_ * 0.0;
      auVar137._4_4_ = auVar66._4_4_ * 0.0;
      auVar137._8_4_ = auVar66._8_4_ * 0.0;
      auVar137._12_4_ = auVar66._12_4_ * 0.0;
      auVar71 = vshufps_avx(auVar137,auVar137,0xe1);
      auVar119._4_4_ = fVar99;
      auVar119._0_4_ = fVar99;
      auVar119._8_4_ = fVar99;
      auVar119._12_4_ = fVar99;
      auVar104._0_4_ = fVar99 + auVar66._0_4_ + auVar71._0_4_;
      auVar104._4_4_ = fVar99 + auVar66._4_4_ + auVar71._4_4_;
      auVar104._8_4_ = fVar99 + auVar66._8_4_ + auVar71._8_4_;
      auVar104._12_4_ = fVar99 + auVar66._12_4_ + auVar71._12_4_;
      uVar14 = pmVar30->value[3].field_0;
      uVar28 = pmVar30->value[3].field_1;
      uVar62._0_4_ = pmVar30->value[2].field_0;
      uVar62._4_4_ = pmVar30->value[2].field_1;
      auVar66 = vaddps_avx512vl(auVar70,auVar69);
      auVar71 = vblendps_avx(auVar78,auVar63,2);
      auVar67 = vaddps_avx512vl(auVar71,auVar66);
      auVar71 = vblendps_avx(auVar63,auVar78,2);
      auVar66 = vaddps_avx512vl(auVar71,auVar66);
      auVar63 = vinsertps_avx(auVar119,auVar72,0x10);
      auVar71 = vhaddps_avx(auVar137,auVar137);
      fVar82 = auVar71._0_4_;
      auVar120._0_4_ = fVar82 + auVar63._0_4_;
      auVar120._4_4_ = fVar82 + auVar63._4_4_;
      auVar120._8_4_ = fVar82 + auVar63._8_4_;
      auVar120._12_4_ = fVar82 + auVar63._12_4_;
      uVar15._0_4_ = pmVar30->value[0].field_0;
      uVar15._4_4_ = pmVar30->value[0].field_1;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar15;
      aVar2 = pmVar30->value[0].field_2;
      auVar138._4_4_ = aVar2;
      auVar138._0_4_ = aVar2;
      auVar138._8_4_ = aVar2;
      auVar138._12_4_ = aVar2;
      auVar63 = vshufps_avx512vl(auVar104,auVar104,0xe1);
      auVar71 = vmulps_avx512vl(auVar138,auVar63);
      auVar72 = vmulps_avx512vl(auVar94,auVar109);
      auVar72 = vshufps_avx512vl(auVar72,auVar72,0xe1);
      auVar68 = vmulps_avx512vl(auVar94,auVar113);
      auVar72 = vaddps_avx512vl(auVar72,auVar68);
      auVar71 = vaddps_avx512vl(auVar71,auVar72);
      auVar130._4_4_ = fVar106;
      auVar130._0_4_ = fVar106;
      auVar130._8_4_ = fVar106;
      auVar130._12_4_ = fVar106;
      auVar121._0_4_ = fVar106 + auVar71._0_4_;
      auVar121._4_4_ = fVar106 + auVar71._4_4_;
      auVar121._8_4_ = fVar106 + auVar71._8_4_;
      auVar121._12_4_ = fVar106 + auVar71._12_4_;
      auVar71 = vmulps_avx512vl(auVar94,auVar67);
      auVar71 = vshufps_avx512vl(auVar71,auVar71,0xe1);
      fVar1 = auVar66._0_4_;
      auVar95._0_4_ = (float)(undefined4)uVar15 * fVar1;
      fVar97 = auVar66._4_4_;
      auVar95._4_4_ = (float)uVar15._4_4_ * fVar97;
      fVar99 = auVar66._8_4_;
      auVar95._8_4_ = fVar99 * 0.0;
      fVar106 = auVar66._12_4_;
      auVar95._12_4_ = fVar106 * 0.0;
      auVar72 = vaddps_avx512vl(auVar71,auVar95);
      auVar68 = vshufps_avx512vl(auVar120,auVar120,0xe1);
      auVar69 = vmulps_avx512vl(auVar138,auVar68);
      auVar71 = vinsertps_avx(auVar130,ZEXT416((uint)fVar100),0x10);
      auVar96._0_4_ = auVar71._0_4_ + auVar69._0_4_ + auVar72._0_4_;
      auVar96._4_4_ = auVar71._4_4_ + auVar69._4_4_ + auVar72._4_4_;
      auVar96._8_4_ = auVar71._8_4_ + auVar69._8_4_ + auVar72._8_4_;
      auVar96._12_4_ = auVar71._12_4_ + auVar69._12_4_ + auVar72._12_4_;
      uVar16._0_4_ = pmVar30->value[1].field_0;
      uVar16._4_4_ = pmVar30->value[1].field_1;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = uVar16;
      aVar2 = pmVar30->value[1].field_2;
      auVar131._4_4_ = aVar2;
      auVar131._0_4_ = aVar2;
      auVar131._8_4_ = aVar2;
      auVar131._12_4_ = aVar2;
      auVar71 = vmulps_avx512vl(auVar63,auVar131);
      auVar72 = vmulps_avx512vl(auVar122,auVar109);
      auVar72 = vshufps_avx512vl(auVar72,auVar72,0xe1);
      auVar69 = vmulps_avx512vl(auVar113,auVar122);
      auVar72 = vaddps_avx512vl(auVar72,auVar69);
      auVar71 = vaddps_avx512vl(auVar72,auVar71);
      auVar115._4_4_ = fVar110;
      auVar115._0_4_ = fVar110;
      auVar115._8_4_ = fVar110;
      auVar115._12_4_ = fVar110;
      auVar139._0_4_ = auVar71._0_4_ + fVar110;
      auVar139._4_4_ = auVar71._4_4_ + fVar110;
      auVar139._8_4_ = auVar71._8_4_ + fVar110;
      auVar139._12_4_ = auVar71._12_4_ + fVar110;
      auVar71 = vmulps_avx512vl(auVar67,auVar122);
      auVar71 = vshufps_avx512vl(auVar71,auVar71,0xe1);
      auVar123._0_4_ = (float)(undefined4)uVar16 * fVar1;
      auVar123._4_4_ = (float)uVar16._4_4_ * fVar97;
      auVar123._8_4_ = fVar99 * 0.0;
      auVar123._12_4_ = fVar106 * 0.0;
      auVar72 = vaddps_avx512vl(auVar71,auVar123);
      auVar68 = vmulps_avx512vl(auVar68,auVar131);
      auVar71 = vinsertps_avx(auVar115,ZEXT416((uint)fVar107),0x10);
      auVar98._0_4_ = auVar72._0_4_ + auVar68._0_4_ + auVar71._0_4_;
      auVar98._4_4_ = auVar72._4_4_ + auVar68._4_4_ + auVar71._4_4_;
      auVar98._8_4_ = auVar72._8_4_ + auVar68._8_4_ + auVar71._8_4_;
      auVar98._12_4_ = auVar72._12_4_ + auVar68._12_4_ + auVar71._12_4_;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uVar62;
      auVar72 = vmulps_avx512vl(auVar67,auVar140);
      auVar71 = vmulps_avx512vl(auVar66,auVar140);
      fVar82 = pmVar30->value[2].field_2.z;
      auVar132._4_4_ = fVar82;
      auVar132._0_4_ = fVar82;
      auVar132._8_4_ = fVar82;
      auVar132._12_4_ = fVar82;
      auVar71 = vshufps_avx(auVar71,auVar71,0xe1);
      auVar116._0_4_ = auVar72._0_4_ + auVar71._0_4_ + auVar120._0_4_ * fVar82;
      auVar116._4_4_ = auVar72._4_4_ + auVar71._4_4_ + auVar120._4_4_ * fVar82;
      auVar116._8_4_ = auVar72._8_4_ + auVar71._8_4_ + auVar120._8_4_ * fVar82;
      auVar116._12_4_ = auVar72._12_4_ + auVar71._12_4_ + auVar120._12_4_ * fVar82;
      auVar63 = vmulps_avx512vl(auVar63,auVar132);
      auVar141._8_8_ = 0;
      auVar141._0_8_ = uVar62;
      auVar71 = vmulps_avx512vl(auVar109,auVar141);
      auVar71 = vshufps_avx(auVar71,auVar71,0xe1);
      auVar72 = vmulps_avx512vl(auVar113,auVar141);
      auVar71 = vaddps_avx512vl(auVar71,auVar72);
      auVar72 = vbroadcastss_avx512vl(auVar64);
      auVar124._0_4_ = auVar71._0_4_ + auVar63._0_4_ + auVar72._0_4_;
      auVar124._4_4_ = auVar71._4_4_ + auVar63._4_4_ + auVar72._4_4_;
      auVar124._8_4_ = auVar71._8_4_ + auVar63._8_4_ + auVar72._8_4_;
      auVar124._12_4_ = auVar71._12_4_ + auVar63._12_4_ + auVar72._12_4_;
      auVar63 = vshufps_avx(auVar116,auVar116,0xe1);
      auVar71 = vinsertps_avx(auVar72,auVar76,0x1c);
      auVar93._0_4_ = auVar63._0_4_ + auVar71._0_4_;
      auVar93._4_4_ = auVar63._4_4_ + auVar71._4_4_;
      auVar93._8_4_ = auVar63._8_4_ + auVar71._8_4_;
      auVar93._12_4_ = auVar63._12_4_ + auVar71._12_4_;
      auVar79._0_4_ = (float)uVar14 * fVar1;
      auVar79._4_4_ = (float)uVar28 * fVar97;
      auVar79._8_4_ = fVar99 * 0.0;
      auVar79._12_4_ = fVar106 * 0.0;
      auVar117._0_4_ = auVar67._0_4_ * (float)uVar14;
      auVar117._4_4_ = auVar67._4_4_ * (float)uVar28;
      auVar117._8_4_ = auVar67._8_4_ * 0.0;
      auVar117._12_4_ = auVar67._12_4_ * 0.0;
      auVar114._0_4_ = (float)uVar14 * auVar113._0_4_;
      auVar114._4_4_ = (float)uVar28 * auVar113._4_4_;
      auVar114._8_4_ = auVar113._8_4_ * 0.0;
      auVar114._12_4_ = auVar113._12_4_ * 0.0;
      auVar72 = vshufps_avx(auVar114,auVar114,0xe1);
      auVar71 = vmovshdup_avx(auVar117);
      auVar63 = vmovshdup_avx(auVar79);
      fVar82 = pmVar30->value[3].field_2.z;
      auVar105._0_4_ = (float)uVar14 * auVar109._0_4_ + auVar72._0_4_ + fVar82 * auVar104._0_4_;
      auVar105._4_4_ = (float)uVar28 * auVar109._4_4_ + auVar72._4_4_ + fVar82 * auVar104._4_4_;
      auVar105._8_4_ = auVar109._8_4_ * 0.0 + auVar72._8_4_ + fVar82 * auVar104._8_4_;
      auVar105._12_4_ = auVar109._12_4_ * 0.0 + auVar72._12_4_ + fVar82 * auVar104._12_4_;
      auVar72 = vmovshdup_avx(auVar120);
      fVar100 = auVar65._0_4_;
      auVar63 = vaddss_avx512f(auVar77,ZEXT416((uint)(auVar117._0_4_ + auVar63._0_4_ +
                                                     auVar120._0_4_ * fVar82)));
      auVar71 = vinsertps_avx(ZEXT416((uint)(auVar79._0_4_ + auVar71._0_4_ + fVar82 * auVar72._0_4_
                                            + fVar100)),auVar63,0x10);
      auVar63 = vshufps_avx(auVar105,auVar105,0xe1);
      auVar89._0_4_ = auVar63._0_4_ + fVar100;
      auVar89._4_4_ = auVar63._4_4_ + fVar100;
      auVar89._8_4_ = auVar63._8_4_ + fVar100;
      auVar89._12_4_ = auVar63._12_4_ + fVar100;
      uVar81 = vmovlps_avx(auVar121);
      pmVar30->value[0].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar81;
      pmVar30->value[0].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar81 >> 0x20);
      uVar81 = vmovlps_avx(auVar96);
      pmVar30->value[0].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar81;
      pmVar30->value[0].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar81 >> 0x20);
      uVar81 = vmovlps_avx(auVar139);
      pmVar30->value[1].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar81;
      pmVar30->value[1].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar81 >> 0x20);
      uVar81 = vmovlps_avx(auVar98);
      pmVar30->value[1].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar81;
      pmVar30->value[1].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar81 >> 0x20);
      uVar81 = vmovlps_avx(auVar124);
      pmVar30->value[2].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar81;
      pmVar30->value[2].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar81 >> 0x20);
      uVar81 = vmovlps_avx(auVar93);
      pmVar30->value[2].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar81;
      pmVar30->value[2].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar81 >> 0x20);
      uVar81 = vmovlps_avx(auVar89);
      pmVar30->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar81;
      pmVar30->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar81 >> 0x20);
      uVar81 = vmovlps_avx(auVar71);
      pmVar30->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(int)uVar81;
      pmVar30->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           (int)((ulong)uVar81 >> 0x20);
      pmVar30 = this->T;
      pmVar30->value[3].field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0;
      pmVar30->value[3].field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1;
      pmVar30->value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2;
      pmVar30->value[3].field_3 =
           (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
           local_188.super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
           super__Head_base<1UL,_float,_false>._M_head_impl;
      pPVar31 = this->Tpers;
      if (pPVar31 != (PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)0x0) {
        pmVar57 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&detail::persistentCache_glmmat4,&pPVar31->name);
        aVar40 = (pPVar31->value).value[0].field_1;
        aVar2 = (pPVar31->value).value[0].field_2;
        aVar41 = (pPVar31->value).value[0].field_3;
        aVar42 = (pPVar31->value).value[1].field_0;
        aVar43 = (pPVar31->value).value[1].field_1;
        aVar44 = (pPVar31->value).value[1].field_2;
        aVar45 = (pPVar31->value).value[1].field_3;
        aVar46 = (pPVar31->value).value[2].field_0;
        aVar47 = (pPVar31->value).value[2].field_1;
        aVar48 = (pPVar31->value).value[2].field_2;
        aVar49 = (pPVar31->value).value[2].field_3;
        aVar50 = (pPVar31->value).value[3].field_0;
        aVar51 = (pPVar31->value).value[3].field_1;
        aVar52 = (pPVar31->value).value[3].field_2;
        aVar53 = (pPVar31->value).value[3].field_3;
        pmVar57->value[0].field_0 = (pPVar31->value).value[0].field_0;
        pmVar57->value[0].field_1 = aVar40;
        pmVar57->value[0].field_2 = aVar2;
        pmVar57->value[0].field_3 = aVar41;
        pmVar57->value[1].field_0 = aVar42;
        pmVar57->value[1].field_1 = aVar43;
        pmVar57->value[1].field_2 = aVar44;
        pmVar57->value[1].field_3 = aVar45;
        pmVar57->value[2].field_0 = aVar46;
        pmVar57->value[2].field_1 = aVar47;
        pmVar57->value[2].field_2 = aVar48;
        pmVar57->value[2].field_3 = aVar49;
        pmVar57->value[3].field_0 = aVar50;
        pmVar57->value[3].field_1 = aVar51;
        pmVar57->value[3].field_2 = aVar52;
        pmVar57->value[3].field_3 = aVar53;
        pPVar31->holdsDefaultValue = false;
      }
      requestRedraw();
      local_138 = auVar111;
    }
    uVar81 = vmovlps_avx(local_138);
    (this->dragPrevVec).field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar81;
    (this->dragPrevVec).field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
         (int)((ulong)uVar81 >> 0x20);
  }
LAB_00237a52:
  (this->dragPrevVec).field_2 = local_168;
LAB_00237a5a:
  return (bool)((byte)uVar60 | this->currentlyDragging);
}

Assistant:

bool TransformationGizmo::interact() {
  if (!enabled.get()) return false;

  ImGuiIO& io = ImGui::GetIO();

  // end a drag, if needed
  bool draggingAtStart = currentlyDragging;
  if (currentlyDragging && (!ImGui::IsMouseDown(0) || !ImGui::IsMousePosValid())) {
    currentlyDragging = false;
  }

  // Get the mouse ray in world space
  glm::vec3 raySource = view::getCameraWorldPosition();
  glm::vec2 mouseCoords{io.MousePos.x, io.MousePos.y};
  glm::vec3 ray = view::screenCoordsToWorldRay(mouseCoords);

  // Get data about the widget
  // (there are much more efficient ways to do this)
  glm::vec3 center(T * glm::vec4{0., 0., 0., 1.});
  glm::vec3 nX(T * glm::vec4{1., 0., 0., 0.});
  glm::vec3 nY(T * glm::vec4{0., 1., 0., 0.});
  glm::vec3 nZ(T * glm::vec4{0., 0., 1., 0.});
  std::array<glm::vec3, 3> axNormals{glm::normalize(nX), glm::normalize(nY), glm::normalize(nZ)};

  float transScale = glm::length(glm::vec3(T[0]));
  float gizmoSize = transScale * gizmoSizeRel * state::lengthScale;
  float diskRad = gizmoSize; // size 1
  float diskWidth = gizmoSize * diskWidthObj;

  if (currentlyDragging) {

    if (selectedType == TransformHandle::Rotation) {

      // Cast against the axis we are currently rotating
      glm::vec3 normal = axNormals[selectedDim];
      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = circleTest(raySource, ray, center, normal, diskRad - diskWidth);

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        // Compute the new nearest normal to the drag
        glm::vec3 nearestDir = glm::normalize(nearestPoint - center);
        float arg = glm::dot(normal, glm::cross(dragPrevVec, nearestDir));
        arg = glm::clamp(arg, -1.f, 1.f);
        float angle = std::asin(arg); // could be fancier with atan, but that's fine

        // Split, transform, and recombine
        glm::vec4 trans(T[3]);
        T[3] = glm::vec4{0., 0., 0., 1.};
        // T.get() = glm::translate(glm::rotate(angle, normal) * glm::translate(T.get(), -trans), trans);
        T = glm::rotate(angle, normal) * T;
        T[3] = trans;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestDir; // store this dir for the next time around
      }
    } else if (selectedType == TransformHandle::Translation) {

      // Cast against the axis we are currently translating

      glm::vec3 normal = axNormals[selectedDim];
      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) =
          lineTest(raySource, ray, center, normal, std::numeric_limits<float>::infinity());

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        // Split, transform, and recombine
        glm::vec3 trans = nearestPoint - dragPrevVec;
        T[3][0] += trans.x;
        T[3][1] += trans.y;
        T[3][2] += trans.z;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestPoint; // store this dir for the next time around
      }

    } else if (selectedType == TransformHandle::Scale) {

      // Cast against the scale sphere

      float dist, tHit;
      glm::vec3 nearestPoint;
      float worldSphereRad = sphereRad * gizmoSize;
      std::tie(tHit, dist, nearestPoint) = sphereTest(raySource, ray, center, worldSphereRad, false);

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        float newWorldRad = glm::length(nearestPoint - center);
        float scaleRatio = newWorldRad / worldSphereRad;

        // Split, transform, and recombine
        glm::vec4 trans(T[3]);
        T[3] = glm::vec4{0., 0., 0., 1.};
        T *= scaleRatio;
        T[3] = trans;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestPoint; // store this dir for the next time around
      }
    }
  } else /* !currentlyDragging */ {

    // == Find the part of the widget that we are closest to

    float firstHit = std::numeric_limits<float>::infinity();
    float hitDist = std::numeric_limits<float>::infinity();
    int hitDim = -1;
    TransformHandle hitType = TransformHandle::None;
    glm::vec3 hitNearest(0., 0., 0.);

    // Test the three rotation directions
    for (int dim = 0; dim < 3; dim++) {

      glm::vec3 normal = axNormals[dim];

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = circleTest(raySource, ray, center, normal, diskRad - diskWidth);

      if (dist < diskWidth && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = dim;
        hitType = TransformHandle::Rotation;
        hitNearest = nearestPoint;
      }
    }

    // Test the three translation directions
    for (int dim = 0; dim < 3; dim++) {

      glm::vec3 normal = axNormals[dim];

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = lineTest(raySource, ray, center, normal, vecLength * gizmoSize);
      tHit -= diskWidth; // pull the hit outward, hackily simulates cylinder radius

      if (dist < diskWidth && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = dim;
        hitType = TransformHandle::Translation;
        hitNearest = nearestPoint;
      }
    }

    { // Test the scaling sphere

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = sphereTest(raySource, ray, center, sphereRad * gizmoSize);

      if (dist == 0. && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = 0;
        hitType = TransformHandle::Scale;
        hitNearest = nearestPoint;
      }
    }

    // = Process the result

    // clear selection before proceeding
    selectedType = TransformHandle::None;
    selectedDim = -1;

    if (hitType == TransformHandle::Rotation && hitDist < diskWidth) {
      // rotation is hovered

      // set new selection
      selectedType = TransformHandle::Rotation;
      selectedDim = hitDim;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        glm::vec3 nearestDir = glm::normalize(hitNearest - center);
        dragPrevVec = nearestDir;
      }
    } else if (hitType == TransformHandle::Translation && hitDist < diskWidth) {
      // translation is hovered

      // set new selection
      selectedType = TransformHandle::Translation;
      selectedDim = hitDim;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        dragPrevVec = hitNearest;
      }
    } else if (hitType == TransformHandle::Scale) {
      // scaling is hovered

      // set new selection
      selectedType = TransformHandle::Scale;
      selectedDim = -1;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        dragPrevVec = hitNearest;
      }
    }
  }

  return currentlyDragging || draggingAtStart;
}